

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O2

bool __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildBoundingBox
          (BoundingBoxProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  Matrix2x3 *pMVar1;
  Polygon2D *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pPVar6;
  pointer pVVar7;
  size_t sVar8;
  Position *pos3dInAbsoluteFrame;
  reference pvVar9;
  size_t poly;
  long lVar10;
  pointer pVVar11;
  size_t vertex;
  ulong idx;
  long lVar12;
  iterator __end1;
  ulong uVar13;
  Vector2 VVar14;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar15;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar16;
  vector<double,_std::allocator<double>_> xCoords;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<double,_std::allocator<double>_> yCoords;
  VectorFixSize<2U> point;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  pMVar1 = &this->P;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)xAxisOfPlaneInWorld;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pMVar1;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)&supportPolygonsExpressedInAbsoluteFrame,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             &projectedPoints);
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&this->field_0x80;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)yAxisOfPlaneInWorld;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)&supportPolygonsExpressedInAbsoluteFrame,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             &projectedPoints);
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  supportPolygonsExpressedInAbsoluteFrame.
  super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&supportPolygonsExpressedInAbsoluteFrame,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(supportPolygonsExpressedInSupportFrame->
                   super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  lVar12 = 0;
  lVar10 = 0;
  uVar13 = 0;
  while( true ) {
    pPVar6 = (supportPolygonsExpressedInSupportFrame->
             super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(supportPolygonsExpressedInSupportFrame->
                       super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) / 0x18) <= uVar13)
    break;
    Polygon::applyTransform
              ((Polygon *)&projectedPoints,
               (Polygon *)
               ((long)&(pPVar6->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl + lVar10),
               (Transform *)(*(long *)absoluteFrame_X_supportFrame + lVar12));
    std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::_M_move_assign
              ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               ((long)&((supportPolygonsExpressedInAbsoluteFrame.
                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_start)->m_vertices).
                       super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10),
               (_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               &projectedPoints);
    std::_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>::~_Vector_base
              ((_Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
               &projectedPoints);
    uVar13 = uVar13 + 1;
    lVar10 = lVar10 + 0x18;
    lVar12 = lVar12 + 0x60;
  }
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  projectedPoints.
  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = 0;
  while( true ) {
    pVVar7 = projectedPoints.
             super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)supportPolygonsExpressedInAbsoluteFrame.
                       super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)supportPolygonsExpressedInAbsoluteFrame.
                      super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar13) break;
    idx = 0;
    while( true ) {
      sVar8 = Polygon::getNrOfVertices
                        (supportPolygonsExpressedInAbsoluteFrame.
                         super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar13);
      if (sVar8 <= idx) break;
      pos3dInAbsoluteFrame =
           Polygon::operator()(supportPolygonsExpressedInAbsoluteFrame.
                               super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar13,idx);
      VVar14 = project(this,pos3dInAbsoluteFrame);
      xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = VVar14.m_data[1];
      xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = VVar14.m_data[0];
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      push_back(&projectedPoints,(value_type *)&xCoords);
      idx = idx + 1;
    }
    uVar13 = uVar13 + 1;
  }
  if (0x20 < (ulong)((long)projectedPoints.
                           super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)projectedPoints.
                          super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    yCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    yCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    yCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (pVVar11 = projectedPoints.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pVVar11 != pVVar7;
        pVVar11 = pVVar11 + 1) {
      point.m_data[0] = pVVar11->m_data[0];
      point.m_data[1] = pVVar11->m_data[1];
      std::vector<double,_std::allocator<double>_>::push_back(&xCoords,point.m_data);
      std::vector<double,_std::allocator<double>_>::push_back(&yCoords,point.m_data + 1);
    }
    pVar15 = std::
             __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        xCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    pVar16 = std::
             __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (yCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        yCoords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    dVar2 = *pVar15.first._M_current._M_current;
    dVar3 = *pVar15.second._M_current._M_current;
    dVar4 = *pVar16.first._M_current._M_current;
    dVar5 = *pVar16.second._M_current._M_current;
    this_00 = &this->projectedBoundingBox;
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&this_00->m_vertices,4);
    pvVar9 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ::at(&this_00->m_vertices,0);
    pvVar9->m_data[0] = dVar2;
    pvVar9->m_data[1] = dVar5;
    pvVar9 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ::at(&this_00->m_vertices,1);
    pvVar9->m_data[0] = dVar2;
    pvVar9->m_data[1] = dVar4;
    pvVar9 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ::at(&this_00->m_vertices,2);
    pvVar9->m_data[0] = dVar3;
    pvVar9->m_data[1] = dVar4;
    pvVar9 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ::at(&this_00->m_vertices,3);
    pvVar9->m_data[0] = dVar3;
    pvVar9->m_data[1] = dVar5;
    buildConstraintMatrix(this);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&yCoords.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&xCoords.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::_Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
  ~_Vector_base(&projectedPoints.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               );
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector
            (&supportPolygonsExpressedInAbsoluteFrame);
  return false;
}

Assistant:

bool BoundingBoxProjectionConstraint::buildBoundingBox(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
      o = originOfPlaneInWorld;
      toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
      toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

      // Transform the polygons in the absolute frame
      std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

      supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

      for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
      {
          supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
      }

      // Project the polygons on the projection plane
      std::vector<Vector2> projectedPoints;

      for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
      {
          for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
          {
               Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
               //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
               projectedPoints.push_back(newProjectedPoint);
          }
      }

      if (projectedPoints.size() <= 2)
      {
          return false;
      }

      // Compute the bounding box
      //  Build a vector from projectedPoints with the x coordinates
      std::vector<double> xCoords;
      std::vector<double> yCoords;
      for (auto point : projectedPoints) {
          xCoords.push_back(point(0));
          yCoords.push_back(point(1));
      }

      // Find min and max x coordinate
      auto minMaxXCoord = std::minmax_element(xCoords.begin(), xCoords.end());
      auto minMaxYCoord = std::minmax_element(yCoords.begin(), yCoords.end());
      double minX, maxX, minY, maxY;
      minX = *minMaxXCoord.first;
      maxX = *minMaxXCoord.second;
      minY = *minMaxYCoord.first;
      maxY = *minMaxYCoord.second;

      // Compute bounding box
      Vector2 vec1, vec2, vec3, vec4;
      vec1(0) = minX; vec1(1) = maxY;
      vec2(0) = maxX; vec2(1) = maxY;
      vec3(0) = maxX; vec3(1) = minY;
      vec4(0) = minX; vec4(1) = minY;

      projectedBoundingBox.m_vertices.resize(4);
      projectedBoundingBox.m_vertices.at(0) = vec1;
      projectedBoundingBox.m_vertices.at(1) = vec4;
      projectedBoundingBox.m_vertices.at(2) = vec3;
      projectedBoundingBox.m_vertices.at(3) = vec2;

      // Build the constraint matrix
      buildConstraintMatrix();
      return false;

      // Update AtimesP matrix
      AtimesP.resize(A.rows(),P.cols());

      toEigen(AtimesP) = toEigen(A)*toEigen(P);

      return true;
    }